

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O0

void slab_put_with_order(slab_cache *cache,slab *slab)

{
  byte bVar1;
  _Bool _Var2;
  rlist *prVar3;
  bool bVar4;
  _Bool local_49;
  slab *local_48;
  slab *buddy;
  slab *slab_local;
  slab_cache *cache_local;
  
  slab_assert(cache,slab);
  if (cache->order_max < slab->order) {
    __assert_fail("slab->order <= cache->order_max",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                  ,0x14e,"void slab_put_with_order(struct slab_cache *, struct slab *)");
  }
  slab_set_free(cache,slab);
  local_48 = slab_buddy(cache,slab);
  buddy = slab;
  if (((local_48 != (slab *)0x0) && (local_48->order == slab->order)) &&
     (_Var2 = slab_is_free(local_48), _Var2)) {
    cache->orders[slab->order].stats.total = cache->orders[slab->order].stats.total - slab->size;
    do {
      buddy = slab_merge(cache,buddy,local_48);
      local_48 = slab_buddy(cache,buddy);
      local_49 = false;
      if ((local_48 != (slab *)0x0) && (local_49 = false, local_48->order == buddy->order)) {
        local_49 = slab_is_free(local_48);
      }
    } while (local_49 != false);
    cache->orders[buddy->order].stats.total = buddy->size + cache->orders[buddy->order].stats.total;
  }
  slab_poison(buddy);
  if (buddy->order == cache->order_max) {
    prVar3 = &cache->orders[buddy->order].slabs;
    bVar4 = false;
    if (prVar3->next == ((rlist *)&prVar3->prev)->prev) {
      bVar4 = prVar3->next == prVar3;
    }
    if (!bVar4) {
      if (buddy->size == (ulong)cache->arena->slab_size) {
        ((buddy->next_in_cache).prev)->next = (buddy->next_in_cache).next;
        ((buddy->next_in_cache).next)->prev = (buddy->next_in_cache).prev;
        (buddy->next_in_cache).next = &buddy->next_in_cache;
        (buddy->next_in_cache).prev = &buddy->next_in_cache;
        (cache->allocated).stats.total = (cache->allocated).stats.total - buddy->size;
        cache->orders[buddy->order].stats.total =
             cache->orders[buddy->order].stats.total - buddy->size;
        slab_unmap(cache->arena,buddy);
        return;
      }
      __assert_fail("slab->size == cache->arena->slab_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                    ,0x170,"void slab_put_with_order(struct slab_cache *, struct slab *)");
    }
  }
  bVar1 = buddy->order;
  prVar3 = &buddy->next_in_list;
  prVar3->prev = &cache->orders[bVar1].slabs;
  (buddy->next_in_list).next = cache->orders[bVar1].slabs.next;
  prVar3->prev->next = prVar3;
  ((buddy->next_in_list).next)->prev = prVar3;
  return;
}

Assistant:

void
slab_put_with_order(struct slab_cache *cache, struct slab *slab)
{
	slab_assert(cache, slab);
	assert(slab->order <= cache->order_max);
	/* An "ordered" slab is returned to the cache. */
	slab_set_free(cache, slab);
	struct slab *buddy = slab_buddy(cache, slab);
	/*
	 * The buddy slab could also have been split into a pair
	 * of smaller slabs, the first of which happens to be
	 * free. To not merge with a slab which is in fact
	 * partially occupied, first check that slab orders match.
	 *
	 * A slab is not accounted in "used" or "total" counters
	 * if it was split into slabs of a lower order.
	 * cache->orders statistics only contains sizes of either
	 * slabs returned by slab_get, or present in the free
	 * list. This ensures that sums of cache->orders[i].stats
	 * match the totals in cache->allocated.stats.
	 */
	if (buddy && buddy->order == slab->order && slab_is_free(buddy)) {
		cache->orders[slab->order].stats.total -= slab->size;
		do {
			slab = slab_merge(cache, slab, buddy);
			buddy = slab_buddy(cache, slab);
		} while (buddy && buddy->order == slab->order &&
			 slab_is_free(buddy));
		cache->orders[slab->order].stats.total += slab->size;
	}
	slab_poison(slab);
	if (slab->order == cache->order_max &&
	    !rlist_empty(&cache->orders[slab->order].slabs)) {
		/*
		 * Largest slab should be returned to arena, but we do so
		 * only if the slab cache has at least one slab of that size
		 * in order to avoid oscillations.
		 */
		assert(slab->size == cache->arena->slab_size);
		slab_list_del(&cache->allocated, slab, next_in_cache);
		cache->orders[slab->order].stats.total -= slab->size;
		slab_unmap(cache->arena, slab);
	} else {
		/* Put the slab to the cache */
		rlist_add_entry(&cache->orders[slab->order].slabs, slab,
				next_in_list);
	}
}